

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::process_req(raft_server *this,req_msg *req,req_ext_params *ext_params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  pointer psVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  element_type *peVar12;
  msg_type type;
  req_ext_params *extraout_RDX;
  req_ext_params *extraout_RDX_00;
  req_ext_params *extraout_RDX_01;
  req_ext_params *extraout_RDX_02;
  req_ext_params *extraout_RDX_03;
  req_ext_params *extraout_RDX_04;
  req_ext_params *extraout_RDX_05;
  req_ext_params *extraout_RDX_06;
  req_ext_params *extraout_RDX_07;
  req_ext_params *extraout_RDX_08;
  req_ext_params *extraout_RDX_09;
  resp_msg *__tmp;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ptr<resp_msg> pVar15;
  Param param;
  string local_78;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined8 local_48;
  unique_lock<std::recursive_mutex> guard;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  
  local_58 = *(undefined4 *)
              &(req->log_entries_).
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_54 = *(undefined4 *)((long)&req->commit_idx_ + 4);
  local_50._0_1_ = true;
  local_50._1_3_ = 0xffffff;
  lVar3 = *(long *)&req[4].super_msg_base.dst_;
  _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ext_params;
  local_48 = ext_params;
  if (*(long *)(lVar3 + 0x80) == 0) {
LAB_001ae82f:
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar4 != (pointer)0x0) &&
       (iVar10 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(),
       _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00, 4 < iVar10))
    {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_type_to_string_abi_cxx11_
                (&local_78,
                 (nuraft *)
                 (ulong)*(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager,
                 (msg_type)extraout_RDX_00);
      msg_if_given_abi_cxx11_
                ((string *)&param,
                 "Receive a %s message from %d with LastLogIndex=%lu, LastLogTerm %lu, EntriesLength=%zu, CommitIndex=%lu and Term=%lu"
                 ,local_78._M_dataplus._M_p,
                 (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base.
                                         _M_manager + 4),ext_params->context_,
                 ext_params->expected_term_,
                 (long)ext_params[1].after_precommit_.super__Function_base._M_manager -
                 *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8
                          ) >> 4,
                 *(undefined8 *)&ext_params[1].after_precommit_.super__Function_base._M_functor,
                 *(undefined8 *)
                  ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8));
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x296,&param);
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
      if ((void **)param._0_8_ != &param.ctx) {
        operator_delete((void *)param._0_8_);
        _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      }
    }
    if (((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000000000) == 0) {
      if (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 5) {
        pVar15 = handle_cli_req_prelock(this,req,ext_params);
        _Var13 = pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        goto LAB_001aedd0;
      }
      guard._M_device = (mutex_type *)&req[0xc].last_log_term_;
      guard._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&guard);
      guard._M_owns = true;
      uVar11 = *(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      if ((uVar11 < 0x11) && ((0x1000aU >> (uVar11 & 0x1f) & 1) != 0)) {
        bVar9 = update_term((raft_server *)req,
                            *(ulong *)((long)&(ext_params->after_precommit_).super__Function_base.
                                              _M_functor + 8));
        if (((char)req[4].super_msg_base.term_ == '\0') &&
           (((bVar9 & ((byte)req[2].last_log_term_ ^ 1)) == 1 &&
            (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 1)))) {
          decay_target_priority((raft_server *)req);
        }
        if (0 < *(int *)((long)&req[4].super_msg_base.term_ + 4)) {
          *(undefined4 *)((long)&req[4].super_msg_base.term_ + 4) = 2;
        }
        uVar11 = *(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      }
      this->_vptr_raft_server = (_func_int **)0x0;
      (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      if ((int)uVar11 < 0x12) {
        if (uVar11 == 1) {
          handle_vote_req((raft_server *)&param,req);
LAB_001aecfd:
          this->_vptr_raft_server = (_func_int **)param._0_8_;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)param._8_8_;
          p_Var14 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)param._0_8_;
        }
        else {
          if (uVar11 != 3) {
LAB_001aecef:
            handle_ext_msg((raft_server *)&param,req);
            goto LAB_001aecfd;
          }
          param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
          param.myId = *(int32_t *)
                        &(req->log_entries_).
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          param.peerId = *(int32_t *)
                          ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4
                          );
          lVar3 = *(long *)&req[4].super_msg_base.dst_;
          param.ctx = ext_params;
          if (*(long *)(lVar3 + 0x80) != 0) {
            local_78._M_dataplus._M_p = (pointer)&param;
            (**(code **)(lVar3 + 0x88))(lVar3 + 0x70);
          }
          handle_append_entries((raft_server *)&param,req);
          uVar8 = param._8_8_;
          uVar7 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar6 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar7;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar8;
          if ((peVar6 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6), param._8_8_ != 0))
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param._8_8_);
          }
          p_Var14 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)this->_vptr_raft_server;
          param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
          param.myId = *(int32_t *)
                        &(req->log_entries_).
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          param.peerId = *(int32_t *)
                          ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4
                          );
          lVar3 = *(long *)&req[4].super_msg_base.dst_;
          param.ctx = p_Var14;
          if (*(long *)(lVar3 + 0x80) != 0) {
            local_78._M_dataplus._M_p = (pointer)&param;
            (**(code **)(lVar3 + 0x88))(lVar3 + 0x70);
          }
        }
        if (p_Var14 != (__weak_count<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001aed16;
      }
      else {
        if (uVar11 != 0x12) {
          if (uVar11 == 0x14) {
            handle_prevote_req((raft_server *)&param,req);
          }
          else {
            if (uVar11 != 0x18) goto LAB_001aecef;
            handle_priority_change_req((raft_server *)&param,req);
          }
          goto LAB_001aecfd;
        }
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar4 != (pointer)0x0) &&
           (iVar10 = (*(code *)(psVar4->
                               super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1].buff_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )(), 3 < iVar10)) {
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"got ping from %d",
                     (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base.
                                             _M_manager + 4));
          (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"process_req",0x2cf,&param);
          if ((void **)param._0_8_ != &param.ctx) {
            operator_delete((void *)param._0_8_);
          }
        }
        p_Var5 = req[9].super_msg_base._vptr_msg_base[1];
        uVar1 = *(undefined4 *)
                 ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4);
        peVar12 = (element_type *)operator_new(0xb0);
        (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x100000001;
        peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bb3a0;
        p_Var14 = &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        uVar2 = *(undefined4 *)
                 &(req->log_entries_).
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (peVar12->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var5;
        *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 0x13;
        *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
        *(undefined4 *)&peVar12->bg_append_ea_ = uVar1;
        (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005bb3f0;
        (peVar12->priority_change_timer_).t_created_.__d.__r = 0;
        (peVar12->priority_change_timer_).duration_us_ = 0;
        *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
        (peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)
         ((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)
         ((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
        *(undefined8 *)
         ((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18) = 0;
        *(undefined8 *)
         ((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20) = 0;
        peVar12->votes_responded_ = 0;
        peVar12->votes_granted_ = 0;
        (peVar12->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        (peVar12->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        (peVar12->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined4 *)&(peVar12->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        peVar12->initialized_ = (__atomic_base<bool>)0x0;
        *(undefined3 *)&peVar12->field_0x31 = 0;
        peVar12->leader_ = (__atomic_base<int>)0x0;
        peVar12->id_ = 0;
        peVar12->my_priority_ = 0;
        *(undefined1 *)&peVar12->target_priority_ = 0;
        this->_vptr_raft_server = (_func_int **)p_Var14;
        peVar6 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
        if (peVar6 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
        }
LAB_001aed16:
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar4 != (pointer)0x0) &&
           (iVar10 = (*(code *)(psVar4->
                               super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1].buff_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )(), 4 < iVar10)) {
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_type_to_string_abi_cxx11_(&local_78,(nuraft *)(ulong)*(uint *)(p_Var14 + 2),type);
          msg_if_given_abi_cxx11_
                    ((string *)&param,
                     "Response back a %s message to %d with Accepted=%d, Term=%lu, NextIndex=%lu",
                     local_78._M_dataplus._M_p,(ulong)*(uint *)(p_Var14 + 3),
                     (ulong)*(byte *)(p_Var14 + 6),*(_func_int **)(p_Var14 + 1),
                     *(_func_int **)(p_Var14 + 4));
          (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar4,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"process_req",0x2e4,&param);
          if ((void **)param._0_8_ != &param.ctx) {
            operator_delete((void *)param._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_09;
      goto LAB_001aedd0;
    }
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar4 != (pointer)0x0) &&
       (iVar10 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(),
       _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04, 2 < iVar10))
    {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_((string *)&param,"stopping, return null");
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x29a,&param);
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
      if ((void **)param._0_8_ != &param.ctx) goto LAB_001ae9fa;
    }
  }
  else {
    local_78._M_dataplus._M_p._0_4_ = 1;
    param._0_8_ = &local_58;
    iVar10 = (**(code **)(lVar3 + 0x88))(lVar3 + 0x70);
    _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (iVar10 != -1) goto LAB_001ae82f;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar4 != (pointer)0x0) &&
       (iVar10 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(),
       _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_06, 2 < iVar10))
    {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_((string *)&param,"by callback, return null");
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x28a,&param);
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_07;
      if ((void **)param._0_8_ == &param.ctx) goto LAB_001ae9ff;
LAB_001ae9fa:
      operator_delete((void *)param._0_8_);
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_08;
    }
  }
LAB_001ae9ff:
  this->_vptr_raft_server = (_func_int **)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001aedd0:
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::process_req(req_msg& req,
                                       const req_ext_params& ext_params) {
    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::ProcessReq, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return null");
        return nullptr;
    }

    p_db( "Receive a %s message from %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm %" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 " and Term=%" PRIu64 "",
          msg_type_to_string(req.get_type()).c_str(),
          req.get_src(),
          req.get_last_log_idx(),
          req.get_last_log_term(),
          req.log_entries().size(),
          req.get_commit_idx(),
          req.get_term() );

    if (stopping_) {
        // Shutting down, ignore all incoming messages.
        p_wn("stopping, return null");
        return nullptr;
    }

    if ( req.get_type() == msg_type::client_request ) {
        // Client request doesn't need to go through below process.
        return handle_cli_req_prelock(req, ext_params);
    }

    recur_lock(lock_);
    if ( req.get_type() == msg_type::append_entries_request ||
         req.get_type() == msg_type::request_vote_request ||
         req.get_type() == msg_type::install_snapshot_request ) {
        // we allow the server to be continue after term updated to save a round message
        bool term_updated = update_term(req.get_term());

        if ( !im_learner_ &&
             !hb_alive_ &&
             term_updated &&
             req.get_type() == msg_type::request_vote_request ) {
            // If someone has newer term, that means leader has not been
            // elected in the current term, and this node's election timer
            // has been reset by this request.
            // We should decay the target priority here.
            decay_target_priority();
        }

        // Reset stepping down value to prevent this server goes down when leader
        // crashes after sending a LeaveClusterRequest
        if (steps_to_down_ > 0) {
            steps_to_down_ = 2;
        }
    }

    ptr<resp_msg> resp;
    if (req.get_type() == msg_type::append_entries_request) {
        {
            cb_func::Param param(id_, leader_, req.get_src(), &req);
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesReq, &param);
        }
        resp = handle_append_entries(req);
        {
            cb_func::Param param(id_, leader_, req.get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::SentAppendEntriesResp, &param);
        }

    } else if (req.get_type() == msg_type::request_vote_request) {
        resp = handle_vote_req(req);

    } else if (req.get_type() == msg_type::pre_vote_request) {
        resp = handle_prevote_req(req);

    } else if (req.get_type() == msg_type::ping_request) {
        p_in("got ping from %d", req.get_src());
        resp = cs_new<resp_msg>( state_->get_term(),
                                 msg_type::ping_response,
                                 id_,
                                 req.get_src() );

    } else if (req.get_type() == msg_type::priority_change_request) {
        resp = handle_priority_change_req(req);

    } else {
        // extended requests
        resp = handle_ext_msg(req);
    }

    if (resp) {
        p_db( "Response back a %s message to %d with Accepted=%d, "
              "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
              msg_type_to_string(resp->get_type()).c_str(),
              resp->get_dst(),
              resp->get_accepted() ? 1 : 0,
              resp->get_term(),
              resp->get_next_idx() );
    }

    return resp;
}